

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
          (QSharedDataPointer<QDnsDomainNameRecordPrivate> *this)

{
  QDnsDomainNameRecordPrivate *pQVar1;
  Data *pDVar2;
  QDnsDomainNameRecordPrivate *pQVar3;
  
  pQVar3 = (QDnsDomainNameRecordPrivate *)operator_new(0x40);
  pQVar1 = (this->d).ptr;
  (pQVar3->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value = (Type)0x0;
  pDVar2 = (pQVar1->super_QDnsRecordPrivate).name.d.d;
  (pQVar3->super_QDnsRecordPrivate).name.d.d = pDVar2;
  (pQVar3->super_QDnsRecordPrivate).name.d.ptr = (pQVar1->super_QDnsRecordPrivate).name.d.ptr;
  (pQVar3->super_QDnsRecordPrivate).name.d.size = (pQVar1->super_QDnsRecordPrivate).name.d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  (pQVar3->super_QDnsRecordPrivate).timeToLive = (pQVar1->super_QDnsRecordPrivate).timeToLive;
  pDVar2 = (pQVar1->value).d.d;
  (pQVar3->value).d.d = pDVar2;
  (pQVar3->value).d.ptr = (pQVar1->value).d.ptr;
  (pQVar3->value).d.size = (pQVar1->value).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  LOCK();
  (pQVar3->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar3->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>
                   .super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>
                   .super_QBasicAtomicInteger<int>._q_value + -1);
  UNLOCK();
  if (((__atomic_base<int>)
       *(__int_type *)
        &(pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) &&
     (pQVar1 = (this->d).ptr, pQVar1 != (QDnsDomainNameRecordPrivate *)0x0)) {
    pDVar2 = (pQVar1->value).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pQVar1->value).d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar2 = (pQVar1->super_QDnsRecordPrivate).name.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate
                  (&((pQVar1->super_QDnsRecordPrivate).name.d.d)->super_QArrayData,2,0x10);
      }
    }
    operator_delete(pQVar1,0x40);
  }
  (this->d).ptr = pQVar3;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}